

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmGeneratorTarget *tgt_00;
  cmLocalGenerator *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pbVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  cmPropertyMap *pcVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar8;
  string *psVar9;
  pointer ppcVar10;
  ostream *poVar11;
  string *psVar12;
  size_t sVar13;
  _Rb_tree_header *p_Var14;
  char *pcVar15;
  bool bVar16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string reportEntry;
  string report;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  uint local_2b4;
  cmLocalGenerator *local_2a0;
  undefined1 local_298 [32];
  string local_278;
  string *local_258;
  cmGeneratorTarget *local_250;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  _Base_ptr local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  char *local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1c0 [32];
  pointer local_1a0;
  undefined8 local_198;
  ios_base local_150 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  bVar4 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  local_2b4 = (uint)bVar4;
  pcVar6 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_48,pcVar6);
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar16 = _Var7._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_208 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_1f8 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  p_Var14 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header;
  local_200 = _Var7._M_current;
  if ((_Rb_tree_header *)local_208 != p_Var14 &&
      _Var7._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar8 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
    local_1c0._0_8_ = (cmLocalGenerator *)0xb;
    local_1c0._8_8_ = " * Target \"";
    local_1c0._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1a0 = (psVar9->_M_dataplus)._M_p;
    local_1c0._24_8_ = psVar9->_M_string_length;
    local_198 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_1c0;
    cmCatViews(&local_248,views);
    if (local_200 != local_1f8) {
      std::__cxx11::string::append((char *)&local_248);
      pcVar15 = "FALSE";
      if (bVar4) {
        pcVar15 = "TRUE";
      }
      local_1c0._0_8_ = (cmLocalGenerator *)(local_1c0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,pcVar15,pcVar15 + ((ulong)bVar4 ^ 5));
      std::__cxx11::string::_M_append((char *)&local_248,local_1c0._0_8_);
      if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
        operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)&local_248);
    std::operator+(&local_228,"INTERFACE_",p);
    local_2a0 = (cmLocalGenerator *)0x0;
    iVar5 = std::__cxx11::string::compare((char *)p);
    if (iVar5 == 0) {
      local_298._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                 (cmGeneratorTarget **)config);
      uVar3 = local_1c0._0_8_;
      __ptr = local_2a0;
      local_1c0._0_8_ = (cmLocalGenerator *)0x0;
      local_2a0 = (cmLocalGenerator *)uVar3;
      if (__ptr != (cmLocalGenerator *)0x0) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2a0,
                   (cmGeneratorExpressionInterpreter *)__ptr);
      }
      if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)0x0) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)local_1c0,
                   (cmGeneratorExpressionInterpreter *)local_1c0._0_8_);
      }
    }
    ppcVar10 = (pvVar8->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_1e8 = (pvVar8->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_1f0 = defaultValue;
    if (ppcVar10 != local_1e8) {
      local_258 = p;
      do {
        tgt_00 = *ppcVar10;
        local_1e0 = ppcVar10;
        pcVar6 = cmTarget::GetProperties(tgt_00->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_1d8,pcVar6);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_228);
        pbVar2 = local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar1 = local_1f8;
        local_250 = tgt_00;
        bVar4 = getTypedProperty<bool>
                          (tgt_00,&local_228,(cmGeneratorExpressionInterpreter *)local_2a0);
        local_298._0_8_ = local_298 + 0x10;
        local_298._8_8_ = 0;
        local_298[0x10] = '\0';
        if (_Var7._M_current != pbVar2) {
          std::__cxx11::string::append(local_298);
          psVar9 = cmTarget::GetName_abi_cxx11_(local_250->Target);
          std::__cxx11::string::_M_append(local_298,(ulong)(psVar9->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_298);
          pcVar15 = "FALSE";
          if (bVar4) {
            pcVar15 = "TRUE";
          }
          local_1c0._0_8_ = local_1c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c0,pcVar15,pcVar15 + ((ulong)bVar4 ^ 5));
          std::__cxx11::string::_M_append(local_298,local_1c0._0_8_);
          if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
            operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
          }
          std::__cxx11::string::append(local_298);
        }
        if (local_200 == pbVar1) {
          if ((_Rb_tree_header *)local_208 == p_Var14) {
            iVar5 = 3;
            if (_Var7._M_current == pbVar2) goto LAB_004d0cc0;
            if (bVar16) {
              std::__cxx11::string::_M_append((char *)&local_248,local_298._0_8_);
              compatibilityAgree_abi_cxx11_((string *)local_1c0,t,false);
              std::__cxx11::string::_M_append((char *)&local_248,local_1c0._0_8_);
              if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
                operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
              }
              if (bVar4 != local_2b4._0_1_) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c0,"The INTERFACE_",0xe);
                psVar9 = local_258;
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c0,(local_258->_M_dataplus)._M_p,
                                     local_258->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," property of \"",0xe);
                psVar12 = cmTarget::GetName_abi_cxx11_(local_250->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" does\nnot agree with the value of ",0x23);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," already determined\nfor \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_278);
                goto LAB_004d09b9;
              }
            }
            else {
              local_1c0._0_8_ = local_1c0 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1c0,local_298._0_8_,
                         (pointer)(local_298._0_8_ + local_298._8_8_));
              std::__cxx11::string::append((char *)local_1c0);
              std::__cxx11::string::_M_append((char *)&local_248,local_1c0._0_8_);
              if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
                operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
              }
              iVar5 = 0;
              bVar16 = true;
              local_2b4 = (uint)bVar4;
            }
          }
          else {
            iVar5 = 3;
            if (_Var7._M_current == pbVar2) {
              local_2b4 = 0;
LAB_004d0cc0:
              iVar5 = 3;
            }
            else {
              std::__cxx11::string::_M_append((char *)&local_248,local_298._0_8_);
              compatibilityAgree_abi_cxx11_((string *)local_1c0,t,false);
              std::__cxx11::string::_M_append((char *)&local_248,local_1c0._0_8_);
              if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
                operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
              }
              if (bVar4) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c0,"Property ",9);
                psVar9 = local_258;
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c0,(local_258->_M_dataplus)._M_p,
                                     local_258->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," on target \"",0xc);
                psVar12 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is\nimplied to be ",0x13);
                pcVar15 = local_1f0;
                if (local_1f0 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar13 = strlen(local_1f0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," property on\ndependency \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(local_250->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_278);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p,
                                  local_278.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
                std::ios_base::~ios_base(local_150);
                iVar5 = 2;
              }
              local_2b4 = 0;
            }
          }
        }
        else {
          iVar5 = 3;
          if (_Var7._M_current == pbVar2) goto LAB_004d0cc0;
          std::__cxx11::string::_M_append((char *)&local_248,local_298._0_8_);
          compatibilityAgree_abi_cxx11_((string *)local_1c0,t,false);
          std::__cxx11::string::_M_append((char *)&local_248,local_1c0._0_8_);
          if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
            operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
          }
          if (bVar4 != local_2b4._0_1_) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Property ",9);
            psVar9 = local_258;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1c0,(local_258->_M_dataplus)._M_p,
                                 local_258->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," on target \"",0xc);
            psVar12 = cmTarget::GetName_abi_cxx11_(tgt->Target);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\" does\nnot match the INTERFACE_",0x1f);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," property requirement\nof dependency \"",0x25);
            psVar9 = cmTarget::GetName_abi_cxx11_(local_250->Target);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_278);
LAB_004d09b9:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
            std::ios_base::~ios_base(local_150);
            iVar5 = 2;
          }
        }
        if ((cmLocalGenerator *)local_298._0_8_ != (cmLocalGenerator *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,CONCAT71(local_298._17_7_,local_298[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8);
        p = local_258;
      } while (((iVar5 == 3) || (iVar5 == 0)) && (ppcVar10 = local_1e0 + 1, ppcVar10 != local_1e8));
    }
    iVar5 = 0x7e5b96;
    if (local_2b4 != 0) {
      iVar5 = 0x8497f8;
    }
    local_1c0._0_8_ = (cmLocalGenerator *)(local_1c0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,iVar5,(local_2b4 ^ 5) + iVar5);
    compatibilityType_abi_cxx11_((string *)local_298,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,p,(string *)local_1c0,&local_248,(string *)local_298);
    if ((cmLocalGenerator *)local_298._0_8_ != (cmLocalGenerator *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_,CONCAT71(local_298._17_7_,local_298[0x10]) + 1);
    }
    if ((cmLocalGenerator *)local_1c0._0_8_ != (cmLocalGenerator *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1c0._16_8_ + 1));
    }
    if (local_2a0 != (cmLocalGenerator *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2a0,
                 (cmGeneratorExpressionInterpreter *)local_2a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    bVar4 = local_2b4._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  local_2b4._0_1_ = bVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2b4._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}